

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
map_caster<std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::load(map_caster<std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,handle src,bool convert)

{
  bool bVar1;
  PyObject **ppPVar2;
  template_cast_op_type<typename_std::add_rvalue_reference<unsigned_int_&&>::type> __args;
  template_cast_op_type<typename_std::add_rvalue_reference<basic_string<char>_&&>::type> __args_1;
  reference rVar3;
  handle local_e0;
  handle local_d8;
  undefined1 local_d0 [8];
  value_conv vconv;
  handle hStack_a8;
  key_conv kconv;
  value_type it;
  dict_iterator __end3;
  undefined1 local_68 [8];
  dict_iterator __begin3;
  dict *__range3;
  dict local_38;
  dict d;
  bool convert_local;
  map_caster<std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  handle src_local;
  
  d.super_object.super_handle.m_ptr = (object)(object)src.m_ptr;
  bVar1 = isinstance<pybind11::dict,_0>(src);
  if (bVar1) {
    reinterpret_borrow<pybind11::dict>((pybind11 *)&local_38,src);
    std::
    map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&this->value);
    __begin3.super_dict_readonly.pos = (ssize_t)&local_38;
    dict::begin((dict_iterator *)local_68,&local_38);
    dict::end((dict_iterator *)&it.second,(dict *)__begin3.super_dict_readonly.pos);
    while (bVar1 = detail::operator!=((It *)local_68,(It *)&it.second), bVar1) {
      rVar3 = generic_iterator<pybind11::detail::iterator_policies::dict_readonly>::operator*
                        ((generic_iterator<pybind11::detail::iterator_policies::dict_readonly> *)
                         local_68);
      it.first = rVar3.second.m_ptr;
      hStack_a8 = rVar3.first.m_ptr;
      type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
      ::type_caster((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                     *)local_d0);
      ppPVar2 = pybind11::handle::ptr(&stack0xffffffffffffff58);
      pybind11::handle::handle(&local_d8,*ppPVar2);
      bVar1 = type_caster<unsigned_int,_void>::load
                        ((type_caster<unsigned_int,_void> *)
                         ((long)&vconv.
                                 super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                 .value.field_2 + 0xc),local_d8,convert);
      if (bVar1) {
        ppPVar2 = pybind11::handle::ptr(&it.first);
        pybind11::handle::handle(&local_e0,*ppPVar2);
        bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        *)local_d0,local_e0,convert);
        if (!bVar1) goto LAB_007d9913;
        __args = cast_op<unsigned_int&&>
                           ((make_caster<unsigned_int_&&> *)
                            ((long)&vconv.
                                    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                    .value.field_2 + 0xc));
        __args_1 = cast_op<std::__cxx11::string&&>
                             ((make_caster<std::__cxx11::basic_string<char>_&&> *)local_d0);
        std::
        map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
        ::emplace<unsigned_int,std::__cxx11::string>
                  ((map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                    *)this,__args,__args_1);
        bVar1 = false;
      }
      else {
LAB_007d9913:
        src_local.m_ptr._7_1_ = 0;
        bVar1 = true;
      }
      type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
      ::~type_caster((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                      *)local_d0);
      if (bVar1) goto LAB_007d99f4;
      generic_iterator<pybind11::detail::iterator_policies::dict_readonly>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::dict_readonly> *)local_68);
    }
    src_local.m_ptr._7_1_ = 1;
LAB_007d99f4:
    dict::~dict(&local_38);
  }
  else {
    src_local.m_ptr._7_1_ = 0;
  }
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<dict>(src))
            return false;
        auto d = reinterpret_borrow<dict>(src);
        value.clear();
        for (auto it : d) {
            key_conv kconv;
            value_conv vconv;
            if (!kconv.load(it.first.ptr(), convert) ||
                !vconv.load(it.second.ptr(), convert))
                return false;
            value.emplace(cast_op<Key &&>(std::move(kconv)), cast_op<Value &&>(std::move(vconv)));
        }
        return true;
    }